

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O2

void nn_sinproc_accept(nn_sinproc *self,nn_sinproc *peer)

{
  if (self->peer == (nn_sinproc *)0x0) {
    self->peer = peer;
    nn_fsm_raiseto(&self->fsm,&peer->fsm,&self->event_connect,0x6c41,2,self);
    nn_fsm_start(&self->fsm);
    nn_fsm_action(&self->fsm,1);
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!self->peer",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
          ,0x76);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_sinproc_accept (struct nn_sinproc *self, struct nn_sinproc *peer)
{
    nn_assert (!self->peer);
    self->peer = peer;

    /*  Start the connecting handshake with the peer. */
    nn_fsm_raiseto (&self->fsm, &peer->fsm, &self->event_connect,
        NN_SINPROC_SRC_PEER, NN_SINPROC_READY, self);

    /*  Notify the state machine. */
    nn_fsm_start (&self->fsm);
    nn_fsm_action (&self->fsm, NN_SINPROC_ACTION_READY);
}